

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O1

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform<long,long>
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,
          ArrayView<soul::Value> args,_func_long_long_long_long *fn)

{
  int64_t iVar1;
  int64_t v;
  int64_t iVar2;
  PackedData local_40;
  
  if ((long)args.s - (long)this == 0xc0) {
    soul::Value::getData(&local_40,(Value *)this);
    iVar1 = soul::Value::PackedData::getAsInt64(&local_40);
    soul::Value::getData(&local_40,(Value *)(this + 0x40));
    v = soul::Value::PackedData::getAsInt64(&local_40);
    soul::Value::getData(&local_40,(Value *)(this + 0x80));
    iVar2 = soul::Value::PackedData::getAsInt64(&local_40);
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    if (v <= iVar1) {
      v = iVar2;
    }
    soul::Value::Value(__return_storage_ptr__,v);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("args.size() == 3","perform",0x2e);
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}